

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O2

void __thiscall
boost::runtime::enum_parameter<boost::unit_test::report_level,_(boost::runtime::args_amount)0>::
value_help(enum_parameter<boost::unit_test::report_level,_(boost::runtime::args_amount)0> *this,
          ostream *ostr)

{
  pointer pbVar1;
  bool bVar2;
  bool bVar3;
  pointer pbVar4;
  basic_cstring<const_char> local_38;
  
  if ((this->super_parameter<boost::unit_test::report_level,_(boost::runtime::args_amount)0,_true>).
      super_basic_param.p_value_hint._M_string_length != 0) {
    std::operator<<(ostr,(string *)
                         &(this->
                          super_parameter<boost::unit_test::report_level,_(boost::runtime::args_amount)0,_true>
                          ).super_basic_param.p_value_hint);
    return;
  }
  std::operator<<(ostr,"<");
  pbVar1 = (this->m_valid_names).
           super__Vector_base<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar2 = true;
  for (pbVar4 = (this->m_valid_names).
                super__Vector_base<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
    local_38.m_begin = pbVar4->m_begin;
    local_38.m_end = pbVar4->m_end;
    bVar3 = false;
    while (!bVar3) {
      if (!bVar2) {
        std::operator<<(ostr,'|');
      }
      unit_test::operator<<(ostr,&local_38);
      bVar2 = false;
      bVar3 = true;
    }
  }
  std::operator<<(ostr,">");
  return;
}

Assistant:

virtual void    value_help( std::ostream& ostr ) const
    {
        if( this->p_value_hint.empty() ) {
            ostr << "<";
            bool first = true;
            BOOST_TEST_FOREACH( cstring, name, m_valid_names ) {
                if( first )
                    first = false;
                else
                    ostr << '|';
                ostr << name;
            }
            ostr << ">";
        }
        else
            ostr << this->p_value_hint;
    }